

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O0

void fio_str_compact(fio_str_s_conflict *s)

{
  int *piVar1;
  byte local_50;
  char local_4f;
  uint64_t local_20;
  size_t len;
  char *tmp;
  fio_str_s_conflict *s_local;
  
  if (((s != (fio_str_s_conflict *)0x0) && (s->small == '\0')) && (s->data != (char *)0x0)) {
    tmp = (char *)s;
    if (s->len < 0x2e) {
      len = (size_t)s->data;
      local_20 = s->len;
      memset(&local_50,0,0x30);
      local_50 = (byte)(local_20 << 1) | 1;
      local_4f = tmp[1];
      memcpy(s,&local_50,0x30);
      if (local_20 != 0) {
        memcpy(tmp + 2,(void *)len,local_20 + 1);
      }
      fio_free((void *)len);
    }
    else {
      len = (size_t)fio_realloc(s->data,s->len + 1);
      if ((void *)len == (void *)0x0) {
        if (0 < FIO_LOG_LEVEL) {
          FIO_LOG2STDERR(
                        "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.h:4078"
                        );
        }
        kill(0,2);
        piVar1 = __errno_location();
        exit(*piVar1);
      }
      *(size_t *)(tmp + 0x28) = len;
      *(undefined8 *)(tmp + 0x10) = *(undefined8 *)(tmp + 0x18);
    }
  }
  return;
}

Assistant:

FIO_FUNC void fio_str_compact(fio_str_s *s) {
  if (!s || (s->small || !s->data))
    return;
  char *tmp;
  if (s->len < FIO_STR_SMALL_CAPA)
    goto shrink2small;
  tmp = fio_realloc(s->data, s->len + 1);
  FIO_ASSERT_ALLOC(tmp);
  s->data = tmp;
  s->capa = s->len;
  return;

shrink2small:
  /* move the string into the container */
  tmp = s->data;
  size_t len = s->len;
  *s = (fio_str_s){.small = (uint8_t)(((len << 1) | 1) & 0xFF),
                   .frozen = s->frozen};
  if (len) {
    memcpy(FIO_STR_SMALL_DATA(s), tmp, len + 1);
  }
  FIO_FREE(tmp);
}